

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

void __thiscall
soul::ResolutionPass::TypeResolver::resolveVariableDeclarationInitialValue
          (TypeResolver *this,VariableDeclaration *v,Type *type)

{
  size_t *psVar1;
  Expression *pEVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  TypeCast *pTVar6;
  Type local_40;
  
  pEVar2 = (v->initialValue).object;
  if (((pEVar2 == (Expression *)0x0) || (pEVar2->kind != value)) ||
     (iVar4 = (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[3])(), (char)iVar4 == '\0'
     )) {
    pEVar2 = (v->initialValue).object;
    if (pEVar2 == (Expression *)0x0) {
      return;
    }
    lVar5 = __dynamic_cast(pEVar2,&AST::Expression::typeinfo,&AST::CommaSeparatedList::typeinfo,0);
    if (lVar5 == 0) {
      return;
    }
  }
  else {
    pEVar2 = (v->initialValue).object;
    if (pEVar2 == (Expression *)0x0) goto LAB_0021827d;
    (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_40);
    bVar3 = Type::isEqual(&local_40,type,0);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_40.structure.object);
    if (bVar3) goto LAB_00218264;
    pEVar2 = (v->initialValue).object;
    if (pEVar2 == (Expression *)0x0) goto LAB_0021827d;
    SanityCheckPass::expectSilentCastPossible
              (&(pEVar2->super_Statement).super_ASTObject.context,type,pEVar2);
  }
  pEVar2 = (v->initialValue).object;
  if (pEVar2 != (Expression *)0x0) {
    pTVar6 = PoolAllocator::
             allocate<soul::AST::TypeCast,soul::AST::Context&,soul::Type_const&,soul::AST::Expression&>
                       (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                        &(pEVar2->super_Statement).super_ASTObject.context,type,pEVar2);
    (v->initialValue).object = &pTVar6->super_Expression;
LAB_00218264:
    (v->declaredType).object = (Expression *)0x0;
    psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).super_RewritingASTVisitor.itemsReplaced
    ;
    *psVar1 = *psVar1 + 1;
    return;
  }
LAB_0021827d:
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

void resolveVariableDeclarationInitialValue (AST::VariableDeclaration& v, const Type& type)
        {
            if (AST::isResolvedAsValue (v.initialValue))
            {
                if (! v.initialValue->getResultType().isIdentical (type))
                {
                    SanityCheckPass::expectSilentCastPossible (v.initialValue->context, type, *v.initialValue);
                    v.initialValue = allocator.allocate<AST::TypeCast> (v.initialValue->context, type, *v.initialValue);
                }

                v.declaredType = {};
                ++itemsReplaced;
            }
            else if (is_type<AST::CommaSeparatedList> (v.initialValue))
            {
                v.initialValue = allocator.allocate<AST::TypeCast> (v.initialValue->context, type, *v.initialValue);
                v.declaredType = {};
                ++itemsReplaced;
            }
        }